

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O1

void __thiscall
Engine_testConstructWithHandlerVector_Test::TestBody
          (Engine_testConstructWithHandlerVector_Test *this)

{
  __uniq_ptr_impl<Handler,_std::default_delete<Handler>_> _Var1;
  bool bVar2;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  Engine e;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  handlers;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  internal local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Engine local_60;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.prefix._M_dataplus._M_p = (pointer)operator_new(8);
  *(undefined ***)local_60.prefix._M_dataplus._M_p = &PTR_HandleMeasures_001b5190;
  std::
  vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
  ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
            ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              *)&local_28,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_60);
  if ((long *)local_60.prefix._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_60.prefix._M_dataplus._M_p + 0x18))();
  }
  local_60.prefix._M_dataplus._M_p = (pointer)operator_new(0x38);
  *(size_type *)local_60.prefix._M_dataplus._M_p = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 8) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x10) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x18) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x20) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x28) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x30) = 0;
  *(undefined ***)local_60.prefix._M_dataplus._M_p = &PTR_HandleMeasures_001b5030;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 8) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x10) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x18) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x20) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x28) = 0;
  *(size_type *)((long)local_60.prefix._M_dataplus._M_p + 0x30) = 0;
  std::
  vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
  ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
            ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              *)&local_28,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.prefix._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_60.prefix._M_dataplus._M_p + 0x18))();
  }
  Engine::Engine(&local_60,"foo",&local_28);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            (local_70,"\"foo\"","e.prefix",(char (*) [4])0x186245,&local_60.prefix);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_80.ptr_ + 8))();
      }
      local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78.data_._0_4_ = 2;
    pvVar3 = Engine::GetHandlers(&local_60);
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)(pvVar3->
                super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar3->
                super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_70,"2","e.GetHandlers().size()",(int *)&local_78,(unsigned_long *)&local_80);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x22,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      pvVar3 = Engine::GetHandlers(&local_60);
      _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
      super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
           (((pvVar3->
             super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
      if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
          _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
          super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
        local_78.data_ = (AssertHelperData *)0x0;
      }
      else {
        local_78.data_ =
             (AssertHelperData *)
             __dynamic_cast(_Var1._M_t.
                            super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                            super__Head_base<0UL,_Handler_*,_false>._M_head_impl,&Handler::typeinfo,
                            &PrintHandler::typeinfo,0);
      }
      testing::internal::CmpHelperNE<decltype(nullptr),PrintHandler*>
                (local_70,"nullptr","dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get())",
                 &local_80.ptr_,(PrintHandler **)&local_78);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_80);
        if (local_68.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                   ,0x23,pcVar4);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
          local_80.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pvVar3 = Engine::GetHandlers(&local_60);
        _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
        super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
             (pvVar3->
             super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
             super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
        if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
            _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
            super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
          local_78.data_ = (AssertHelperData *)0x0;
        }
        else {
          local_78.data_ =
               (AssertHelperData *)
               __dynamic_cast(_Var1._M_t.
                              super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                              super__Head_base<0UL,_Handler_*,_false>._M_head_impl,
                              &Handler::typeinfo,&TestHandler::typeinfo,0);
        }
        testing::internal::CmpHelperNE<decltype(nullptr),TestHandler*>
                  (local_70,"nullptr","dynamic_cast<TestHandler *>(e.GetHandlers()[1].get())",
                   &local_80.ptr_,(TestHandler **)&local_78);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_80);
          if (local_68.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                     ,0x24,pcVar4);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
            local_80.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::~vector(&local_60.handlers);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.prefix._M_dataplus._M_p != &local_60.prefix.field_2) {
    operator_delete(local_60.prefix._M_dataplus._M_p,
                    local_60.prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

TEST(Engine, testAddIntegerNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Add("foo", 100000000);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100000000, im.value);
    ASSERT_EQ(0, im.tags.size());
}